

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

TexDictionary * rw::TexDictionary::streamRead(Stream *stream)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  bool bVar3;
  int16 iVar4;
  TexDictionary *this;
  Texture *object;
  int iVar5;
  
  bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar3) {
    iVar4 = Stream::readI16(stream);
    Stream::readI16(stream);
    this = create();
    if (this != (TexDictionary *)0x0) {
      if (0 < iVar4) {
        iVar5 = (int)iVar4;
        do {
          bVar3 = findChunk(stream,0x15,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar3) {
            streamRead();
            goto LAB_00111acc;
          }
          object = Texture::streamReadNative(stream);
          if (object == (Texture *)0x0) goto LAB_00111acc;
          PluginList::streamRead((PluginList *)&Texture::s_plglist,stream,object);
          if (object->dict != (TexDictionary *)0x0) {
            pLVar1 = (object->inDict).next;
            pLVar2 = (object->inDict).prev;
            pLVar2->next = pLVar1;
            pLVar1->prev = pLVar2;
          }
          object->dict = this;
          (object->inDict).next = &(this->textures).link;
          pLVar1 = (this->textures).link.prev;
          (object->inDict).prev = pLVar1;
          pLVar1->next = &object->inDict;
          (this->textures).link.prev = &object->inDict;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      bVar3 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
      if (bVar3) {
        return this;
      }
LAB_00111acc:
      destroy(this);
    }
  }
  else {
    streamRead();
  }
  return (TexDictionary *)0x0;
}

Assistant:

TexDictionary*
TexDictionary::streamRead(Stream *stream)
{
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	int32 numTex = stream->readI16();
	stream->readI16(); // device id (0 = unknown, 1 = d3d8, 2 = d3d9,
	                   // 3 = gcn, 4 = null, 5 = opengl,
	                   // 6 = ps2, 7 = softras, 8 = xbox, 9 = psp)
	TexDictionary *txd = TexDictionary::create();
	if(txd == nil)
		return nil;
	Texture *tex;
	for(int32 i = 0; i < numTex; i++){
		if(!findChunk(stream, ID_TEXTURENATIVE, nil, nil)){
			RWERROR((ERR_CHUNK, "TEXTURENATIVE"));
			goto fail;
		}
		tex = Texture::streamReadNative(stream);
		if(tex == nil)
			goto fail;
		Texture::s_plglist.streamRead(stream, tex);
		txd->add(tex);
	}
	if(s_plglist.streamRead(stream, txd))
		return txd;
fail:
	txd->destroy();
	return nil;
}